

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

array_impl<std::shared_ptr<iclient>,_std::shared_ptr<user>,_std::shared_ptr<timer>_> * __thiscall
boost::ext::di::v1_3_0::providers::stack_over_heap::
get<boost::ext::di::v1_3_0::core::array_impl<std::shared_ptr<iclient>,std::shared_ptr<user>,std::shared_ptr<timer>>,boost::ext::di::v1_3_0::core::successful::wrapper<std::shared_ptr<user>,boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,user,std::shared_ptr<user>&>>,boost::ext::di::v1_3_0::core::successful::wrapper<std::shared_ptr<timer>,boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,timer*>>>
          (array_impl<std::shared_ptr<iclient>,_std::shared_ptr<user>,_std::shared_ptr<timer>_>
           *__return_storage_ptr__,stack_over_heap *this,direct *param_1,stack *param_2,
          wrapper<std::shared_ptr<user>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_user,_std::shared_ptr<user>_&>_>
          *args,wrapper<std::shared_ptr<timer>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_timer_*>_>
                *args_1)

{
  shared_ptr<timer> local_58;
  shared_ptr<user> local_48;
  wrapper<std::shared_ptr<timer>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_timer_*>_>
  *local_38;
  wrapper<std::shared_ptr<timer>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_timer_*>_>
  *args_local_1;
  wrapper<std::shared_ptr<user>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_user,_std::shared_ptr<user>_&>_>
  *args_local;
  stack *param_2_local;
  direct *param_1_local;
  stack_over_heap *this_local;
  
  local_38 = args_1;
  args_local_1 = (wrapper<std::shared_ptr<timer>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_timer_*>_>
                  *)args;
  args_local = (wrapper<std::shared_ptr<user>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_user,_std::shared_ptr<user>_&>_>
                *)param_2;
  param_2_local = (stack *)param_1;
  param_1_local = (direct *)this;
  this_local = (stack_over_heap *)__return_storage_ptr__;
  core::successful::wrapper::operator_cast_to_shared_ptr((wrapper *)&local_48);
  core::successful::wrapper::operator_cast_to_shared_ptr((wrapper *)&local_58);
  core::array_impl<std::shared_ptr<iclient>,_std::shared_ptr<user>,_std::shared_ptr<timer>_>::
  array_impl(__return_storage_ptr__,(remove_named_t<std::shared_ptr<user>_> *)&local_48,
             (remove_named_t<std::shared_ptr<timer>_> *)&local_58);
  std::shared_ptr<timer>::~shared_ptr(&local_58);
  std::shared_ptr<user>::~shared_ptr(&local_48);
  return __return_storage_ptr__;
}

Assistant:

auto get(const type_traits::direct&, const type_traits::stack&, TArgs&&... args) const {
    return T(static_cast<TArgs&&>(args)...);
  }